

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O2

void * index_tree_next(index_tree_node *node)

{
  index_tree_node *piVar1;
  index_tree_node *piVar2;
  bool bVar3;
  
  piVar1 = node->right;
  if (node->right == (index_tree_node *)0x0) {
    do {
      piVar2 = node->parent;
      if (piVar2 == (index_tree_node *)0x0) {
        return (void *)0x0;
      }
      bVar3 = piVar2->right == node;
      node = piVar2;
    } while (bVar3);
  }
  else {
    do {
      piVar2 = piVar1;
      piVar1 = piVar2->left;
    } while (piVar2->left != (index_tree_node *)0x0);
  }
  return piVar2;
}

Assistant:

static void *
index_tree_next(const index_tree_node *node)
{
	if (node->right != NULL) {
		node = node->right;
		while (node->left != NULL)
			node = node->left;

		return (void *)(node);
	}

	while (node->parent != NULL && node->parent->right == node)
		node = node->parent;

	return (void *)(node->parent);
}